

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
nonstd::optional_lite::detail::storage_t<tinyusdz::ListOp<tinyusdz::Path>_>::construct_value
          (storage_t<tinyusdz::ListOp<tinyusdz::Path>_> *this,value_type *v)

{
  pointer pPVar1;
  
  *(bool *)this = v->is_explicit;
  pPVar1 = (v->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)this + 8) =
       (v->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((long)this + 0x10) = pPVar1;
  *(pointer *)((long)this + 0x18) =
       (v->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (v->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (v->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (v->explicit_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (v->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)this + 0x20) =
       (v->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)this + 0x28) = pPVar1;
  *(pointer *)((long)this + 0x30) =
       (v->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (v->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (v->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (v->added_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (v->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)this + 0x38) =
       (v->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((long)this + 0x40) = pPVar1;
  *(pointer *)((long)this + 0x48) =
       (v->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (v->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (v->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (v->prepended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (v->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)this + 0x50) =
       (v->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((long)this + 0x58) = pPVar1;
  *(pointer *)((long)this + 0x60) =
       (v->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (v->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (v->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (v->appended_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (v->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)this + 0x68) =
       (v->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((long)this + 0x70) = pPVar1;
  *(pointer *)((long)this + 0x78) =
       (v->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (v->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (v->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (v->deleted_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (v->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)this + 0x80) =
       (v->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((long)this + 0x88) = pPVar1;
  *(pointer *)((long)this + 0x90) =
       (v->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (v->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (v->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (v->ordered_items).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

ListOp() : is_explicit(false) {}